

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int JS_IsFunction(JSContext *ctx,JSValue val)

{
  ushort uVar1;
  uint uVar2;
  
  uVar2 = 0;
  if ((int)val.tag == -1) {
    uVar1 = *(ushort *)((long)val.u.ptr + 6);
    if (uVar1 == 0xd) {
      return 1;
    }
    if (uVar1 == 0x29) {
      return (int)*(byte *)(*(long *)((long)val.u.ptr + 0x30) + 0x20);
    }
    uVar2 = (uint)(ctx->rt->class_array[uVar1].call != (JSClassCall *)0x0);
  }
  return uVar2;
}

Assistant:

BOOL JS_IsFunction(JSContext *ctx, JSValueConst val)
{
    JSObject *p;
    if (JS_VALUE_GET_TAG(val) != JS_TAG_OBJECT)
        return FALSE;
    p = JS_VALUE_GET_OBJ(val);
    switch(p->class_id) {
    case JS_CLASS_BYTECODE_FUNCTION:
        return TRUE;
    case JS_CLASS_PROXY:
        return p->u.proxy_data->is_func;
    default:
        return (ctx->rt->class_array[p->class_id].call != NULL);
    }
}